

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

SurfaceInteraction * __thiscall
pbrt::Transform::ApplyInverse
          (SurfaceInteraction *__return_storage_ptr__,Transform *this,SurfaceInteraction *si)

{
  float fVar1;
  float fVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  float fVar6;
  Float FVar7;
  Float FVar8;
  float fVar9;
  Float FVar10;
  Float FVar11;
  float fVar12;
  Float FVar13;
  float fVar14;
  float fVar15;
  ulong uVar16;
  undefined8 uVar17;
  bool bVar18;
  uintptr_t uVar19;
  Float FVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar39;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  *(undefined8 *)&(__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z = 0;
  (__return_storage_ptr__->material).
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = 0;
  (__return_storage_ptr__->areaLight).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = 0;
  (__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->dpdy).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->dpdy).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  __return_storage_ptr__->dudx = 0.0;
  __return_storage_ptr__->dvdx = 0.0;
  __return_storage_ptr__->dudy = 0.0;
  __return_storage_ptr__->dvdy = 0.0;
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = 0;
  (__return_storage_ptr__->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (__return_storage_ptr__->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  (__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z = 0;
  (__return_storage_ptr__->super_Interaction).mediumInterface = (MediumInterface *)0x0;
  (__return_storage_ptr__->super_Interaction).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->dpdv).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->dpdv).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.z = 0;
  (__return_storage_ptr__->dndv).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  (__return_storage_ptr__->dndv).super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  operator()((Point3fi *)__return_storage_ptr__,this,(Point3fi *)si);
  fVar1 = (si->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar27._4_4_ = fVar1;
  auVar27._0_4_ = fVar1;
  auVar27._8_4_ = fVar1;
  auVar27._12_4_ = fVar1;
  fVar2 = (this->m).m[1][2];
  uVar16 = *(ulong *)(this->m).m[1];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar16;
  auVar21 = vbroadcastss_avx512vl
                      (ZEXT416((uint)(si->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x)
                      );
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(this->m).m[0];
  auVar22 = vbroadcastss_avx512vl
                      (ZEXT416((uint)(si->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z)
                      );
  FVar3 = (this->m).m[0][2];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(this->m).m[2];
  FVar4 = (this->m).m[2][2];
  FVar5 = (this->mInv).m[0][0];
  fVar6 = (this->mInv).m[0][1];
  FVar7 = (this->mInv).m[0][2];
  FVar8 = (this->mInv).m[1][0];
  fVar9 = (this->mInv).m[1][1];
  FVar10 = (this->mInv).m[1][2];
  FVar11 = (this->mInv).m[2][0];
  fVar12 = (this->mInv).m[2][1];
  FVar13 = (this->mInv).m[2][2];
  auVar23 = vmulss_avx512f(ZEXT416((uint)fVar2),auVar27);
  fVar36 = (float)uVar16;
  auVar28._0_4_ = fVar36 * fVar1;
  fVar39 = (float)(uVar16 >> 0x20);
  auVar28._4_4_ = fVar39 * fVar1;
  auVar28._8_4_ = fVar1 * 0.0;
  auVar28._12_4_ = fVar1 * 0.0;
  auVar24 = vfmadd231ps_avx512vl(auVar28,auVar35,auVar21);
  auVar21 = vfmadd231ss_avx512f(auVar23,ZEXT416((uint)FVar3),auVar21);
  auVar23 = vfmadd231ps_avx512vl(auVar24,auVar34,auVar22);
  auVar22 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)FVar4),auVar22);
  auVar21._0_4_ = auVar23._0_4_ * auVar23._0_4_;
  auVar21._4_4_ = auVar23._4_4_ * auVar23._4_4_;
  auVar21._8_4_ = auVar23._8_4_ * auVar23._8_4_;
  auVar21._12_4_ = auVar23._12_4_ * auVar23._12_4_;
  auVar24 = vmulss_avx512f(auVar22,auVar22);
  auVar21 = vhaddps_avx(auVar21,auVar21);
  auVar21 = vaddss_avx512f(auVar24,auVar21);
  auVar21 = vsqrtss_avx(auVar21,auVar21);
  auVar24 = vbroadcastss_avx512vl(auVar21);
  auVar21 = vdivss_avx512f(auVar22,auVar21);
  auVar22 = vdivps_avx512vl(auVar23,auVar24);
  uVar17 = vmovlps_avx(auVar22);
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x =
       (float)(int)uVar17;
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z = auVar21._0_4_
  ;
  fVar1 = (si->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar14 = (si->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar15 = (si->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21 = vmulss_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)fVar1));
  auVar22 = vmulss_avx512f(ZEXT416((uint)fVar9),ZEXT416((uint)fVar1));
  auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)FVar5),ZEXT416((uint)fVar14));
  auVar22 = vfmadd231ss_avx512f(auVar22,ZEXT416((uint)FVar8),ZEXT416((uint)fVar14));
  auVar23 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar1 * fVar12)),ZEXT416((uint)FVar11),
                                ZEXT416((uint)fVar14));
  auVar24 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)FVar7),ZEXT416((uint)fVar15));
  auVar22 = vfmadd231ss_avx512f(auVar22,ZEXT416((uint)FVar10),ZEXT416((uint)fVar15));
  auVar23 = vfmadd231ss_avx512f(auVar23,ZEXT416((uint)FVar13),ZEXT416((uint)fVar15));
  auVar21 = vmulss_avx512f(auVar24,auVar24);
  auVar25 = vmulss_avx512f(auVar22,auVar22);
  auVar21 = vaddss_avx512f(auVar21,auVar25);
  auVar25 = vmulss_avx512f(auVar23,auVar23);
  auVar21 = vaddss_avx512f(auVar25,auVar21);
  auVar21 = vsqrtss_avx(auVar21,auVar21);
  auVar24 = vdivss_avx512f(auVar24,auVar21);
  auVar22 = vdivss_avx512f(auVar22,auVar21);
  auVar22 = vinsertps_avx512f(auVar24,auVar22,0x10);
  uVar17 = vmovlps_avx512f(auVar22);
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)uVar17;
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z =
       auVar23._0_4_ / auVar21._0_4_;
  (__return_storage_ptr__->super_Interaction).time = (si->super_Interaction).time;
  (__return_storage_ptr__->super_Interaction).mediumInterface =
       (si->super_Interaction).mediumInterface;
  (__return_storage_ptr__->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float> =
       (si->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float>;
  fVar1 = (si->dpdu).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar14 = (si->dpdu).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar15 = (si->dpdu).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21 = vmulss_avx512f(ZEXT416((uint)fVar6),ZEXT416((uint)fVar1));
  auVar22 = vmulss_avx512f(ZEXT416((uint)fVar9),ZEXT416((uint)fVar1));
  auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)FVar5),ZEXT416((uint)fVar14));
  auVar22 = vfmadd231ss_avx512f(auVar22,ZEXT416((uint)FVar8),ZEXT416((uint)fVar14));
  auVar23 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar1 * fVar12)),ZEXT416((uint)FVar11),
                                ZEXT416((uint)fVar14));
  auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)FVar7),ZEXT416((uint)fVar15));
  auVar22 = vfmadd231ss_avx512f(auVar22,ZEXT416((uint)FVar10),ZEXT416((uint)fVar15));
  auVar23 = vfmadd231ss_avx512f(auVar23,ZEXT416((uint)FVar13),ZEXT416((uint)fVar15));
  auVar21 = vinsertps_avx512f(auVar21,auVar22,0x10);
  uVar17 = vmovlps_avx512f(auVar21);
  (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar17;
  (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->dpdu).super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
  fVar1 = (si->dpdv).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar14 = (si->dpdv).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar15 = (si->dpdv).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar31 = ZEXT416((uint)fVar6);
  auVar21 = vmulss_avx512f(auVar31,ZEXT416((uint)fVar1));
  auVar25 = ZEXT416((uint)fVar9);
  auVar22 = vmulss_avx512f(auVar25,ZEXT416((uint)fVar1));
  auVar29 = ZEXT416((uint)FVar5);
  auVar21 = vfmadd231ss_avx512f(auVar21,auVar29,ZEXT416((uint)fVar14));
  auVar27 = ZEXT416((uint)FVar8);
  auVar22 = vfmadd231ss_avx512f(auVar22,auVar27,ZEXT416((uint)fVar14));
  auVar44 = ZEXT416((uint)FVar11);
  auVar23 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar1 * fVar12)),auVar44,ZEXT416((uint)fVar14));
  auVar30 = ZEXT416((uint)FVar7);
  auVar21 = vfmadd231ss_avx512f(auVar21,auVar30,ZEXT416((uint)fVar15));
  auVar28 = ZEXT416((uint)FVar10);
  auVar22 = vfmadd231ss_avx512f(auVar22,auVar28,ZEXT416((uint)fVar15));
  auVar26 = ZEXT416((uint)FVar13);
  auVar23 = vfmadd231ss_avx512f(auVar23,auVar26,ZEXT416((uint)fVar15));
  auVar21 = vinsertps_avx512f(auVar21,auVar22,0x10);
  uVar17 = vmovlps_avx512f(auVar21);
  (__return_storage_ptr__->dpdv).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar17;
  (__return_storage_ptr__->dpdv).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->dpdv).super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
  fVar1 = (si->dndu).super_Tuple3<pbrt::Normal3,_float>.y;
  auVar21 = vbroadcastss_avx512vl(ZEXT416((uint)(si->dndu).super_Tuple3<pbrt::Normal3,_float>.x));
  auVar22 = vbroadcastss_avx512vl(ZEXT416((uint)(si->dndu).super_Tuple3<pbrt::Normal3,_float>.z));
  auVar32._0_4_ = fVar36 * fVar1;
  auVar32._4_4_ = fVar39 * fVar1;
  auVar32._8_4_ = fVar1 * 0.0;
  auVar32._12_4_ = fVar1 * 0.0;
  auVar23 = vfmadd231ps_avx512vl(auVar32,auVar35,auVar21);
  auVar21 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar2 * fVar1)),ZEXT416((uint)FVar3),auVar21);
  auVar23 = vfmadd231ps_avx512vl(auVar23,auVar34,auVar22);
  auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)FVar4),auVar22);
  uVar17 = vmovlps_avx(auVar23);
  (__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar17;
  (__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->dndu).super_Tuple3<pbrt::Normal3,_float>.z = auVar21._0_4_;
  fVar1 = (si->dndv).super_Tuple3<pbrt::Normal3,_float>.y;
  auVar21 = vbroadcastss_avx512vl(ZEXT416((uint)(si->dndv).super_Tuple3<pbrt::Normal3,_float>.x));
  auVar22 = vbroadcastss_avx512vl(ZEXT416((uint)(si->dndv).super_Tuple3<pbrt::Normal3,_float>.z));
  auVar33._0_4_ = fVar36 * fVar1;
  auVar33._4_4_ = fVar39 * fVar1;
  auVar33._8_4_ = fVar1 * 0.0;
  auVar33._12_4_ = fVar1 * 0.0;
  auVar23 = vfmadd231ps_avx512vl(auVar33,auVar35,auVar21);
  auVar32 = ZEXT416((uint)FVar3);
  auVar21 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar2 * fVar1)),auVar32,auVar21);
  auVar23 = vfmadd231ps_avx512vl(auVar23,auVar34,auVar22);
  auVar33 = ZEXT416((uint)FVar4);
  auVar21 = vfmadd231ss_avx512f(auVar21,auVar33,auVar22);
  uVar17 = vmovlps_avx(auVar23);
  (__return_storage_ptr__->dndv).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar17;
  (__return_storage_ptr__->dndv).super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->dndv).super_Tuple3<pbrt::Normal3,_float>.z = auVar21._0_4_;
  fVar1 = (si->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar23._4_4_ = fVar1;
  auVar23._0_4_ = fVar1;
  auVar23._8_4_ = fVar1;
  auVar23._12_4_ = fVar1;
  fVar14 = (si->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar40._4_4_ = fVar14;
  auVar40._0_4_ = fVar14;
  auVar40._8_4_ = fVar14;
  auVar40._12_4_ = fVar14;
  auVar22 = vbroadcastss_avx512vl
                      (ZEXT416((uint)(si->shading).n.super_Tuple3<pbrt::Normal3,_float>.z));
  auVar23 = vmulss_avx512f(ZEXT416((uint)fVar2),auVar23);
  auVar24._0_4_ = fVar36 * fVar1;
  auVar24._4_4_ = fVar39 * fVar1;
  auVar24._8_4_ = fVar1 * 0.0;
  auVar24._12_4_ = fVar1 * 0.0;
  auVar21 = vfmadd231ps_fma(auVar24,auVar35,auVar40);
  auVar23 = vfmadd231ss_avx512f(auVar23,auVar32,auVar40);
  auVar24 = vfmadd231ps_avx512vl(auVar21,auVar34,auVar22);
  auVar22 = vfmadd231ss_avx512f(auVar23,auVar33,auVar22);
  auVar41._0_4_ = auVar24._0_4_ * auVar24._0_4_;
  auVar41._4_4_ = auVar24._4_4_ * auVar24._4_4_;
  auVar41._8_4_ = auVar24._8_4_ * auVar24._8_4_;
  auVar41._12_4_ = auVar24._12_4_ * auVar24._12_4_;
  auVar23 = vmulss_avx512f(auVar22,auVar22);
  auVar21 = vhaddps_avx(auVar41,auVar41);
  auVar21 = vaddss_avx512f(auVar23,auVar21);
  auVar21 = vsqrtss_avx(auVar21,auVar21);
  auVar23 = vbroadcastss_avx512vl(auVar21);
  auVar21 = vdivss_avx512f(auVar22,auVar21);
  auVar22 = vdivps_avx512vl(auVar24,auVar23);
  uVar17 = vmovlps_avx(auVar22);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar17;
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = auVar21._0_4_;
  fVar1 = (si->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar14 = (si->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar15 = (si->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21 = vmulss_avx512f(auVar31,ZEXT416((uint)fVar1));
  auVar22 = vmulss_avx512f(auVar25,ZEXT416((uint)fVar1));
  auVar21 = vfmadd231ss_avx512f(auVar21,auVar29,ZEXT416((uint)fVar14));
  auVar22 = vfmadd231ss_avx512f(auVar22,auVar27,ZEXT416((uint)fVar14));
  auVar23 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar1 * fVar12)),auVar44,ZEXT416((uint)fVar14));
  auVar21 = vfmadd231ss_avx512f(auVar21,auVar30,ZEXT416((uint)fVar15));
  auVar22 = vfmadd231ss_avx512f(auVar22,auVar28,ZEXT416((uint)fVar15));
  auVar23 = vfmadd231ss_avx512f(auVar23,auVar26,ZEXT416((uint)fVar15));
  auVar21 = vinsertps_avx512f(auVar21,auVar22,0x10);
  uVar17 = vmovlps_avx512f(auVar21);
  (__return_storage_ptr__->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar17;
  (__return_storage_ptr__->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
  fVar1 = (si->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar14 = (si->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar15 = (si->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21 = vmulss_avx512f(auVar31,ZEXT416((uint)fVar1));
  auVar22 = vmulss_avx512f(auVar25,ZEXT416((uint)fVar1));
  auVar21 = vfmadd231ss_avx512f(auVar21,auVar29,ZEXT416((uint)fVar14));
  auVar22 = vfmadd231ss_avx512f(auVar22,auVar27,ZEXT416((uint)fVar14));
  auVar23 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar1 * fVar12)),auVar44,ZEXT416((uint)fVar14));
  auVar21 = vfmadd231ss_avx512f(auVar21,auVar30,ZEXT416((uint)fVar15));
  auVar22 = vfmadd231ss_avx512f(auVar22,auVar28,ZEXT416((uint)fVar15));
  auVar23 = vfmadd231ss_avx512f(auVar23,auVar26,ZEXT416((uint)fVar15));
  auVar21 = vinsertps_avx512f(auVar21,auVar22,0x10);
  uVar17 = vmovlps_avx512f(auVar21);
  (__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar17;
  (__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
  fVar1 = (si->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar25._4_4_ = fVar1;
  auVar25._0_4_ = fVar1;
  auVar25._8_4_ = fVar1;
  auVar25._12_4_ = fVar1;
  fVar14 = (si->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar42._4_4_ = fVar14;
  auVar42._0_4_ = fVar14;
  auVar42._8_4_ = fVar14;
  auVar42._12_4_ = fVar14;
  auVar22 = vbroadcastss_avx512vl
                      (ZEXT416((uint)(si->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z));
  auVar21 = vmulps_avx512vl(auVar37,auVar25);
  auVar23 = vfmadd231ps_avx512vl(auVar21,auVar35,auVar42);
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar1)),auVar32,auVar42);
  auVar23 = vfmadd231ps_avx512vl(auVar23,auVar34,auVar22);
  auVar21 = vfmadd231ss_avx512f(auVar21,auVar33,auVar22);
  uVar17 = vmovlps_avx512f(auVar23);
  (__return_storage_ptr__->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar17;
  (__return_storage_ptr__->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z = auVar21._0_4_;
  fVar1 = (si->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y;
  fVar14 = (si->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar43._4_4_ = fVar14;
  auVar43._0_4_ = fVar14;
  auVar43._8_4_ = fVar14;
  auVar43._12_4_ = fVar14;
  auVar38._0_4_ = fVar36 * fVar1;
  auVar38._4_4_ = fVar39 * fVar1;
  auVar38._8_4_ = fVar1 * 0.0;
  auVar38._12_4_ = fVar1 * 0.0;
  auVar21 = vfmadd231ps_fma(auVar38,auVar43,auVar35);
  fVar14 = (si->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar31._4_4_ = fVar14;
  auVar31._0_4_ = fVar14;
  auVar31._8_4_ = fVar14;
  auVar31._12_4_ = fVar14;
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar1)),auVar32,auVar43);
  auVar21 = vfmadd231ps_fma(auVar21,auVar31,auVar34);
  auVar22 = vfmadd231ss_fma(auVar22,auVar33,auVar31);
  uVar17 = vmovlps_avx(auVar21);
  (__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar17;
  (__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z = auVar22._0_4_;
  FVar3 = si->dvdx;
  FVar4 = si->dudy;
  FVar20 = si->dvdy;
  __return_storage_ptr__->dudx = si->dudx;
  __return_storage_ptr__->dvdx = FVar3;
  __return_storage_ptr__->dudy = FVar4;
  __return_storage_ptr__->dvdy = FVar20;
  fVar1 = (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar2 = (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar14 = (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar1)),auVar29,ZEXT416((uint)fVar2));
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar9)),auVar27,ZEXT416((uint)fVar2));
  auVar23 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar1 * fVar12)),auVar44,ZEXT416((uint)fVar2));
  auVar21 = vfmadd231ss_fma(auVar21,auVar30,ZEXT416((uint)fVar14));
  auVar22 = vfmadd231ss_fma(auVar22,auVar28,ZEXT416((uint)fVar14));
  auVar23 = vfmadd231ss_fma(auVar23,auVar26,ZEXT416((uint)fVar14));
  auVar21 = vinsertps_avx(auVar21,auVar22,0x10);
  uVar17 = vmovlps_avx(auVar21);
  (__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar17;
  (__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->dpdx).super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
  fVar1 = (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar2 = (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar14 = (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar1)),ZEXT416((uint)fVar2),ZEXT416((uint)FVar5)
                           );
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar9)),ZEXT416((uint)fVar2),ZEXT416((uint)FVar8)
                           );
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar14),ZEXT416((uint)FVar7));
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar14),ZEXT416((uint)FVar10));
  auVar23 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar1 * fVar12)),ZEXT416((uint)FVar11),
                                ZEXT416((uint)fVar2));
  auVar21 = vinsertps_avx(auVar21,auVar22,0x10);
  uVar17 = vmovlps_avx(auVar21);
  (__return_storage_ptr__->dpdy).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar17;
  (__return_storage_ptr__->dpdy).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  auVar21 = vfmadd231ss_fma(auVar23,ZEXT416((uint)FVar13),ZEXT416((uint)fVar14));
  (__return_storage_ptr__->dpdy).super_Tuple3<pbrt::Vector3,_float>.z = auVar21._0_4_;
  uVar19 = (si->areaLight).
           super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           .bits;
  (__return_storage_ptr__->material).
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = (si->material).
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          .bits;
  (__return_storage_ptr__->areaLight).
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = uVar19;
  uVar16._0_4_ = (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uVar16._4_4_ = (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar16;
  fVar1 = (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  fVar2 = (__return_storage_ptr__->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar21 = vmovshdup_avx(auVar26);
  auVar22 = ZEXT416((uint)(fVar1 * fVar2));
  auVar21 = vfmadd132ss_fma(auVar21,auVar22,
                            ZEXT416((uint)(__return_storage_ptr__->super_Interaction).n.
                                          super_Tuple3<pbrt::Normal3,_float>.y));
  auVar22 = vfmsub213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),auVar22);
  auVar21 = vfmadd132ss_fma(auVar26,ZEXT416((uint)(auVar21._0_4_ + auVar22._0_4_)),
                            ZEXT416((uint)(__return_storage_ptr__->super_Interaction).n.
                                          super_Tuple3<pbrt::Normal3,_float>.x));
  auVar22._0_12_ = ZEXT812(0);
  auVar22._12_4_ = 0;
  if (auVar21._0_4_ < 0.0) {
    auVar26._0_8_ = uVar16 ^ 0x8000000080000000;
    auVar26._8_4_ = 0x80000000;
    auVar26._12_4_ = 0x80000000;
  }
  uVar17 = vcmpss_avx512f(auVar21,auVar22,1);
  bVar18 = (bool)((byte)uVar17 & 1);
  uVar17 = vmovlps_avx(auVar26);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar17;
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
       (float)((uint)bVar18 * (int)-fVar1 + (uint)!bVar18 * (int)fVar1);
  __return_storage_ptr__->faceIndex = si->faceIndex;
  return __return_storage_ptr__;
}

Assistant:

SurfaceInteraction Transform::ApplyInverse(const SurfaceInteraction &si) const {
    SurfaceInteraction ret;
    ret.pi = (*this)(si.pi);

    // Transform remaining members of _SurfaceInteraction_
    Transform t = Inverse(*this);
    ret.n = Normalize(t(si.n));
    ret.wo = Normalize(t(si.wo));
    ret.time = si.time;
    ret.mediumInterface = si.mediumInterface;
    ret.uv = si.uv;
    ret.dpdu = t(si.dpdu);
    ret.dpdv = t(si.dpdv);
    ret.dndu = t(si.dndu);
    ret.dndv = t(si.dndv);
    ret.shading.n = Normalize(t(si.shading.n));
    ret.shading.dpdu = t(si.shading.dpdu);
    ret.shading.dpdv = t(si.shading.dpdv);
    ret.shading.dndu = t(si.shading.dndu);
    ret.shading.dndv = t(si.shading.dndv);
    ret.dudx = si.dudx;
    ret.dvdx = si.dvdx;
    ret.dudy = si.dudy;
    ret.dvdy = si.dvdy;
    ret.dpdx = t(si.dpdx);
    ret.dpdy = t(si.dpdy);
    ret.material = si.material;
    ret.areaLight = si.areaLight;
    //    ret.n = FaceForward(ret.n, ret.shading.n);
    ret.shading.n = FaceForward(ret.shading.n, ret.n);
    ret.faceIndex = si.faceIndex;
    return ret;
}